

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_set_covered(MultiFab *mf,int icomp,int ncomp,int ngrow,Real val)

{
  BoxArray *this;
  IndexType IVar1;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::EBCellFlagFab> *this_01;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint32_t *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int local_1c4;
  long local_180;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter mfi;
  
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo);
  if (this_00 != (EBFArrayBoxFactory *)0x0) {
    this_01 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    this = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    IVar1 = BATransformer::index_type(&this->m_bat);
    if ((IVar1.itype != 0) && (IVar1 = BATransformer::index_type(&this->m_bat), IVar1.itype != 7)) {
      Assert_host("mf.ixType().cellCentered() || mf.ixType().nodeCentered()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                  ,0x21,(char *)0x0);
    }
    IVar1 = BATransformer::index_type(&this->m_bat);
    iVar11 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    if (iVar11 < ngrow) {
      ngrow = iVar11;
    }
    MFIter::MFIter(&mfi,(FabArrayBase *)mf,true);
    if (ncomp < 1) {
      ncomp = 0;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox(&local_12c,&mfi,ngrow);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(&local_d0,this_01,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
      lVar2 = (long)local_12c.smallend.vect[0];
      lVar3 = (long)local_12c.smallend.vect[1];
      if (IVar1.itype == 0) {
        lVar14 = (long)icomp << 3;
        for (uVar6 = 0; lVar19 = (long)local_12c.smallend.vect[2], uVar6 != (uint)ncomp;
            uVar6 = uVar6 + 1) {
          for (; (int)lVar19 <= local_12c.bigend.vect[2]; lVar19 = lVar19 + 1) {
            puVar9 = (uint32_t *)
                     ((long)&local_d0.p
                             [lVar2 + ((lVar19 - local_d0.begin.z) * local_d0.kstride -
                                      (long)local_d0.begin.x)].flag +
                     (lVar3 - local_d0.begin.y) * local_d0.jstride * 4);
            for (lVar4 = lVar3; lVar4 <= local_12c.bigend.vect[1]; lVar4 = lVar4 + 1) {
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                lVar5 = 0;
                do {
                  if ((~puVar9[lVar5] & 3) == 0) {
                    *(Real *)((long)local_110.p +
                             lVar5 * 8 +
                             local_110.nstride * lVar14 +
                             (lVar19 - local_110.begin.z) * local_110.kstride * 8 +
                             (lVar4 - local_110.begin.y) * local_110.jstride * 8 +
                             (long)local_110.begin.x * -8 + lVar2 * 8) = val;
                  }
                  lVar5 = lVar5 + 1;
                } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar5);
              }
              puVar9 = puVar9 + local_d0.jstride;
            }
          }
          lVar14 = lVar14 + 8;
        }
      }
      else {
        local_180 = (long)icomp << 3;
        for (uVar6 = 0; lVar14 = (long)local_12c.smallend.vect[2],
            local_1c4 = local_12c.smallend.vect[2] + -1, uVar6 != (uint)ncomp; uVar6 = uVar6 + 1) {
          for (; iVar16 = (int)lVar14, lVar19 = lVar3, iVar11 = local_12c.smallend.vect[1] + -1,
              iVar16 <= local_12c.bigend.vect[2]; lVar14 = lVar14 + 1) {
            for (; iVar17 = (int)lVar19, iVar17 <= local_12c.bigend.vect[1]; lVar19 = lVar19 + 1) {
              lVar21 = (long)local_d0.begin.x;
              lVar18 = (~local_d0.begin.z + iVar16) * local_d0.kstride;
              lVar12 = (iVar16 - local_d0.begin.z) * local_d0.kstride;
              lVar5 = (lVar14 - local_d0.begin.z) * local_d0.kstride * 4;
              lVar13 = (long)(local_1c4 - local_d0.begin.z) * local_d0.kstride * 4;
              lVar7 = (~local_d0.begin.y + iVar17) * local_d0.jstride;
              lVar10 = (iVar17 - local_d0.begin.y) * local_d0.jstride;
              lVar15 = (long)(iVar11 - local_d0.begin.y) * local_d0.jstride * 4;
              lVar4 = (lVar19 - local_d0.begin.y) * local_d0.jstride * 4;
              for (lVar8 = 0; lVar2 + lVar8 <= (long)local_12c.bigend.vect[0]; lVar8 = lVar8 + 1) {
                lVar20 = (long)(((local_12c.smallend.vect[0] + -1) - local_d0.begin.x) + (int)lVar8)
                ;
                if ((((((~local_d0.p[lVar7 + lVar20 + lVar18].flag & 3) == 0) &&
                      ((~*(uint *)((long)&local_d0.p[lVar2 + (lVar8 - lVar21)].flag +
                                  lVar15 + lVar13) & 3) == 0)) &&
                     ((~local_d0.p[lVar10 + lVar20 + lVar18].flag & 3) == 0)) &&
                    (((~*(uint *)((long)&local_d0.p[lVar2 + (lVar8 - lVar21)].flag + lVar4 + lVar13)
                      & 3) == 0 && ((~local_d0.p[lVar7 + lVar20 + lVar12].flag & 3) == 0)))) &&
                   (((~*(uint *)((long)&local_d0.p[lVar2 + (lVar8 - lVar21)].flag + lVar5 + lVar15)
                     & 3) == 0 &&
                    (((~local_d0.p[lVar10 + lVar20 + lVar12].flag & 3) == 0 &&
                     ((~*(uint *)((long)&local_d0.p[lVar2 + (lVar8 - lVar21)].flag + lVar5 + lVar4)
                      & 3) == 0)))))) {
                  *(Real *)((long)local_110.p +
                           lVar8 * 8 +
                           local_110.nstride * local_180 +
                           (lVar19 - local_110.begin.y) * local_110.jstride * 8 +
                           (lVar14 - local_110.begin.z) * local_110.kstride * 8 +
                           (long)local_110.begin.x * -8 + lVar2 * 8) = val;
                }
              }
              iVar11 = iVar11 + 1;
            }
            local_1c4 = local_1c4 + 1;
          }
          local_180 = local_180 + 8;
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = val;
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,val);
            });
        }
    }
}